

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomGradientStop::write(DomGradientStop *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomColor *this_00;
  char16_t *pcVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar4._4_4_ = in_register_00000034;
  aVar4._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"gradientstop";
    local_50.size = 0xc;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar6.m_size = (size_t)local_50.ptr;
  QVar6.field_0.m_data = aVar4.m_data;
  QXmlStreamWriter::writeStartElement(QVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (this->m_has_attr_position == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"position",8);
    pcVar2 = local_50.ptr;
    aVar3.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number(this->m_attr_position,(char)&local_80,0x66);
    QVar5.m_size = (size_t)local_80.ptr;
    QVar5.field_0.m_data = aVar3.m_data;
    QVar7.m_size = (size_t)pcVar2;
    QVar7.field_0.m_data = aVar4.m_data;
    QXmlStreamWriter::writeAttribute(QVar7,QVar5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    __n = (size_t)local_80.ptr;
  }
  if ((this->m_children & 1) != 0) {
    this_00 = this->m_color;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"color",5);
    DomColor::write(this_00,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomGradientStop::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("gradientstop") : tagName.toLower());

    if (hasAttributePosition())
        writer.writeAttribute(u"position"_s, QString::number(attributePosition(), 'f', 15));

    if (m_children & Color)
        m_color->write(writer, u"color"_s);

    writer.writeEndElement();
}